

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

void av1_get_one_pass_rt_params
               (AV1_COMP *cpi,FRAME_TYPE *frame_type,EncodeFrameInput *frame_input,uint frame_flags)

{
  aom_tune_content aVar1;
  RESIZE_STATE RVar2;
  aom_rc_mode aVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  LAYER_CONTEXT *pLVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  SequenceHeader *pSVar9;
  uchar *puVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  FrameDimensionCfg *pFVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte *pbVar19;
  int iVar20;
  uint uVar21;
  AV1_PRIMARY *pAVar22;
  long lVar23;
  uint64_t *puVar24;
  _Bool _Var25;
  sbyte sVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  int *piVar32;
  int iVar33;
  uint uVar34;
  uint8_t *puVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  int iVar41;
  long lVar42;
  uint8_t *puVar43;
  int *piVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined8 in_stack_fffffffffffffee0;
  uint local_f0;
  uint local_ec;
  long local_e8;
  YV12_BUFFER_CONFIG *local_e0;
  int best_intmv_col;
  ulong local_d0;
  long local_c8;
  byte *local_c0;
  uint local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  double local_a8;
  undefined8 uStack_a0;
  EncodeFrameInput *local_90;
  YV12_BUFFER_CONFIG *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  ulong local_58;
  double local_50;
  ulong local_48;
  ulong local_40;
  uint local_34;
  
  pAVar5 = cpi->ppi;
  iVar20 = (cpi->svc).spatial_layer_id;
  iVar37 = (cpi->svc).number_temporal_layers;
  iVar41 = (cpi->svc).temporal_layer_id;
  iVar31 = (cpi->oxcf).rc_cfg.max_consec_drop_ms;
  local_90 = frame_input;
  if (0 < iVar31) {
    local_a8 = cpi->framerate;
    uStack_a0 = 0;
    dVar46 = round(local_a8);
    in_stack_fffffffffffffee0 = 0x208579;
    dVar47 = ceil(((double)((ulong)dVar46 & -(ulong)(1.0 < local_a8) |
                           ~-(ulong)(1.0 < local_a8) & (ulong)local_a8) * (double)iVar31) / 1000.0);
    dVar46 = 2147483647.0;
    if (dVar47 <= 2147483647.0) {
      dVar46 = dVar47;
    }
    (cpi->rc).max_consec_drop = (int)dVar46;
  }
  pAVar22 = pAVar5;
  if (pAVar5->use_svc != 0) {
    av1_update_temporal_layer_framerate(cpi);
    in_stack_fffffffffffffee0 = 0x2085bd;
    av1_restore_layer_context(cpi);
    pAVar22 = cpi->ppi;
  }
  lVar42 = (long)iVar37 * (long)iVar20 + (long)iVar41;
  if (((((pAVar22->rtc_ref).set_ref_frame_config == 0) || ((cpi->svc).number_temporal_layers != 1))
      || ((cpi->svc).number_spatial_layers != 1)) ||
     ((pAVar22->rtc_ref).reference_was_previous_frame != true)) {
LAB_00208609:
    _Var25 = false;
  }
  else {
    in_stack_fffffffffffffee0 = 0x2085f6;
    iVar20 = av1_svc_get_min_ref_dist(cpi);
    _Var25 = true;
    if (iVar20 + 0x80000001U < 0x80000006) goto LAB_00208609;
  }
  pAVar22 = cpi->ppi;
  (pAVar22->rtc_ref).bias_recovery_frame = _Var25;
  if (((frame_flags & 1) == 0) && ((cpi->common).current_frame.frame_number != 0)) {
    if (pAVar22->use_svc == 0) {
      if ((cpi->oxcf).kf_cfg.auto_key == true) {
        uVar27 = (cpi->rc).frames_to_key;
joined_r0x0020867e:
        if (uVar27 == 0) goto LAB_002086f8;
      }
    }
    else if (((cpi->svc).spatial_layer_id == 0) && ((cpi->oxcf).kf_cfg.auto_key == true)) {
      uVar27 = (cpi->oxcf).kf_cfg.key_freq_max;
      if (uVar27 != 0) {
        uVar27 = (cpi->svc).current_superframe % uVar27;
        goto joined_r0x0020867e;
      }
      goto LAB_002086f8;
    }
    *frame_type = '\x01';
    (pAVar5->gf_group).update_type[cpi->gf_frame_index] = '\x01';
    (pAVar5->gf_group).frame_type[cpi->gf_frame_index] = '\x01';
    (pAVar5->gf_group).refbuf_state[cpi->gf_frame_index] = '\x01';
    pAVar22 = cpi->ppi;
    if (pAVar22->use_svc != 0) {
      pLVar6 = (cpi->svc).layer_context;
      if ((cpi->svc).spatial_layer_id == 0) {
        iVar20 = 0;
      }
      else {
        iVar20 = pLVar6[(cpi->svc).temporal_layer_id].is_key_frame;
      }
      pLVar6[(int)lVar42].is_key_frame = iVar20;
    }
    if ((pAVar22->rtc_ref).set_ref_frame_config != 0) {
      lVar39 = 0;
      do {
        if ((pAVar22->rtc_ref).reference[lVar39] != 0) goto LAB_002087f7;
        lVar39 = lVar39 + 1;
      } while (lVar39 != 7);
      *frame_type = '\x02';
    }
  }
  else {
LAB_002086f8:
    *frame_type = '\0';
    if ((cpi->common).current_frame.frame_number == 0) {
      uVar27 = 0;
    }
    else {
      uVar27 = (uint)((cpi->rc).frames_to_key == 0);
    }
    (pAVar5->p_rc).this_key_frame_forced = uVar27;
    (cpi->rc).frames_to_key = (cpi->oxcf).kf_cfg.key_freq_max;
    (pAVar5->p_rc).kf_boost = 0x8fc;
    (pAVar5->gf_group).update_type[cpi->gf_frame_index] = '\0';
    (pAVar5->gf_group).frame_type[cpi->gf_frame_index] = '\0';
    (pAVar5->gf_group).refbuf_state[cpi->gf_frame_index] = '\0';
    pAVar22 = cpi->ppi;
    if (pAVar22->use_svc != 0) {
      if ((cpi->common).current_frame.frame_number != 0) {
        in_stack_fffffffffffffee0 = 0x20878d;
        av1_svc_reset_temporal_layers(cpi,1);
        pAVar22 = cpi->ppi;
      }
      (cpi->svc).layer_context[lVar42].is_key_frame = 1;
    }
    (cpi->rc).frame_number_encoded = 0;
    (pAVar22->rtc_ref).non_reference_frame = 0;
    (cpi->rc).static_since_last_scene_change = 0;
  }
LAB_002087f7:
  local_c0 = frame_type;
  if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive != 100)) {
    if (((cpi->sf).rt_sf.check_scene_detection != 0) && ((cpi->svc).spatial_layer_id == 0)) {
      if (((cpi->rc).prev_coded_width == (cpi->common).width) &&
         ((cpi->rc).prev_coded_height == (cpi->common).height)) {
        pYVar7 = local_90->source;
        pYVar8 = local_90->last_source;
        pFVar16 = &(cpi->oxcf).frm_dim_cfg;
        piVar44 = &(cpi->oxcf).frm_dim_cfg.height;
        if ((cpi->svc).number_spatial_layers < 2) {
          piVar44 = &(cpi->common).height;
          pFVar16 = (FrameDimensionCfg *)&(cpi->common).width;
        }
        iVar20 = pFVar16->width;
        iVar37 = *piVar44;
        if ((iVar20 != (cpi->common).render_width) ||
           ((pYVar8 == (YV12_BUFFER_CONFIG *)0x0 || pYVar7 == (YV12_BUFFER_CONFIG *)0x0) ||
            iVar37 != (cpi->common).render_height)) {
          in_stack_fffffffffffffee0 = 0x2088ff;
          aom_free(cpi->src_sad_blk_64x64);
          cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
        }
        if (pYVar8 != (YV12_BUFFER_CONFIG *)0x0 && pYVar7 != (YV12_BUFFER_CONFIG *)0x0) {
          if (((pYVar7->field_0).field_0.y_width != (pYVar8->field_0).field_0.y_width) ||
             ((pYVar7->field_1).field_0.y_height != (pYVar8->field_1).field_0.y_height))
          goto LAB_00208a1b;
          puVar35 = (pYVar7->field_5).buffers[0];
          iVar41 = (pYVar7->field_4).field_0.y_stride;
          puVar43 = (pYVar8->field_5).buffers[0];
          iVar31 = (pYVar8->field_4).field_0.y_stride;
          (cpi->rc).high_source_sad = 0;
          (cpi->rc).percent_blocks_with_motion = 0;
          (cpi->rc).max_block_source_sad = 0;
          (cpi->rc).prev_avg_source_sad = (cpi->rc).avg_source_sad;
          iVar33 = (cpi->svc).number_spatial_layers;
          piVar44 = &(cpi->common).mi_params.mi_cols;
          if (1 < iVar33) {
            piVar44 = &(cpi->svc).mi_cols_full_resoln;
          }
          piVar32 = &(cpi->svc).mi_rows_full_resoln;
          if (iVar33 < 2) {
            piVar32 = &(cpi->common).mi_params.mi_rows;
          }
          aVar1 = (cpi->oxcf).tune_cfg.content;
          iVar33 = (cpi->common).width;
          iVar29 = (cpi->common).height;
          if ((cpi->sf).rt_sf.higher_thresh_scene_detection == 0) {
            local_f0 = 10000;
            if (aVar1 == AOM_CONTENT_SCREEN) {
              local_f0 = 8000;
            }
            if (iVar29 * iVar33 < 0x12c01) {
              dVar46 = cpi->framerate;
              goto LAB_00209063;
            }
LAB_00209077:
            lVar39 = (ulong)(aVar1 != AOM_CONTENT_SCREEN) + 5;
          }
          else {
            local_f0 = 100000;
            if (0x12c00 < iVar29 * iVar33) goto LAB_00209077;
            dVar46 = cpi->framerate;
            local_f0 = 100000;
            if (dVar46 < 10.0) {
              local_f0 = 50000;
            }
LAB_00209063:
            lVar39 = 5;
            if (10.0 <= dVar46) goto LAB_00209077;
          }
          pSVar9 = (cpi->common).seq_params;
          iVar33 = pSVar9->mib_size >> (pSVar9->sb_size == BLOCK_128X128);
          uVar27 = (*piVar44 + iVar33 + -1) / iVar33;
          iVar33 = (*piVar32 + iVar33 + -1) / iVar33;
          iVar29 = -1;
          if ((cpi->rc).prev_frame_is_dropped == 0) {
            iVar29 = -(uint)(1 < (cpi->svc).number_temporal_layers);
          }
          local_e8 = lVar42;
          local_e0 = pYVar7;
          local_88 = pYVar8;
          if (((iVar20 == (cpi->common).render_width) && (iVar37 == (cpi->common).render_height)) &&
             (cpi->src_sad_blk_64x64 == (uint64_t *)0x0)) {
            in_stack_fffffffffffffee0 = 0x209103;
            puVar24 = (uint64_t *)aom_calloc((long)(int)(iVar33 * uVar27),8);
            cpi->src_sad_blk_64x64 = puVar24;
            if (puVar24 == (uint64_t *)0x0) {
              in_stack_fffffffffffffee0 = 0x209134;
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cpi->src_sad_blk_64x64");
            }
          }
          uVar38 = iVar29 + iVar33;
          if ((int)uVar38 < 1) {
            (cpi->rc).high_source_sad = 0;
            uVar30 = (cpi->rc).avg_source_sad * 3;
            (cpi->rc).avg_source_sad = uVar30 >> 2;
            (cpi->rc).frame_source_sad = 0;
            uVar40 = 0;
          }
          else {
            local_b4 = (cpi->common).mi_params.mi_rows;
            uVar21 = (cpi->common).mi_params.mi_cols;
            local_48 = (ulong)uVar21;
            puVar10 = (cpi->active_map).map;
            local_60 = (long)(int)((iVar41 - uVar27) * 0x40);
            local_68 = (long)(int)((iVar31 - uVar27) * 0x40);
            local_d0 = (ulong)uVar27;
            local_70 = (ulong)uVar38;
            local_78 = (ulong)(uVar21 << 4);
            local_40 = (ulong)(uVar21 * 4);
            dVar46 = 0.0;
            uVar30 = 0;
            iVar20 = 0;
            uVar40 = 0;
            local_b8 = uVar38;
            local_80 = lVar39;
            do {
              local_58 = uVar30;
              local_50 = dVar46;
              if (0 < (int)uVar27) {
                local_b0 = local_b4 + (int)uVar30 * -0x10;
                local_ac = 0x10;
                if (local_b0 < 0x10) {
                  local_ac = local_b0;
                }
                local_c8 = uVar30 * local_d0;
                uVar30 = 0;
                do {
                  if (((cpi->active_map).enabled == 0) || ((cpi->rc).percent_blocks_inactive < 1)) {
LAB_00209296:
                    in_stack_fffffffffffffee0 = 0x2092c1;
                    local_a8 = dVar46;
                    uVar38 = (*cpi->ppi->fn_ptr[0xc].sdf)(puVar35,iVar41,puVar43,iVar31);
                    uVar36 = (ulong)uVar38;
                    dVar46 = local_a8;
                  }
                  else if (local_b0 < 1) {
                    uVar36 = 0;
                  }
                  else {
                    iVar33 = (int)local_48 + (int)uVar30 * -0x10;
                    iVar37 = 0x10;
                    if (iVar33 < 0x10) {
                      iVar37 = iVar33;
                    }
                    iVar29 = 0;
                    dVar47 = dVar46;
                    do {
                      if (0 < iVar33) {
                        lVar42 = 0;
                        do {
                          if (puVar10[SUB84(dVar47,0) + (int)lVar42] == '\0') goto LAB_00209296;
                          lVar42 = lVar42 + 4;
                        } while (lVar42 < iVar37);
                      }
                      iVar29 = iVar29 + 4;
                      dVar47 = (double)((long)dVar47 + local_40);
                      uVar36 = 0;
                    } while (iVar29 < local_ac);
                  }
                  if (cpi->src_sad_blk_64x64 != (uint64_t *)0x0) {
                    cpi->src_sad_blk_64x64[uVar30 + local_c8] = uVar36;
                  }
                  iVar20 = iVar20 + (uint)(uVar36 == 0);
                  if ((cpi->rc).max_block_source_sad < uVar36) {
                    (cpi->rc).max_block_source_sad = uVar36;
                  }
                  uVar40 = uVar40 + uVar36;
                  puVar35 = puVar35 + 0x40;
                  puVar43 = puVar43 + 0x40;
                  uVar30 = uVar30 + 1;
                  dVar46 = (double)((long)dVar46 + 0x10);
                } while (uVar30 != local_d0);
              }
              puVar43 = puVar43 + local_68;
              puVar35 = puVar35 + local_60;
              uVar30 = local_58 + 1;
              dVar46 = (double)((long)local_50 + local_78);
            } while (uVar30 != local_70);
            if ((int)uVar27 < 1) {
              uVar27 = 0;
            }
            uVar27 = local_b8 * uVar27;
            if (0 < (int)uVar27) {
              uVar40 = uVar40 / uVar27;
            }
            uVar11 = (cpi->rc).avg_source_sad;
            uVar38 = (int)local_80 * (int)uVar11;
            if (uVar38 < local_f0) {
              uVar38 = local_f0;
            }
            bVar45 = true;
            uVar21 = 0;
            if ((uVar38 < uVar40) &&
               (uVar21 = 0, (cpi->svc).number_spatial_layers + 1 < (cpi->rc).frames_since_key)) {
              if (SBORROW4(iVar20,((int)uVar27 >> 2) * 3) != iVar20 + ((int)uVar27 >> 2) * -3 < 0) {
                uVar21 = 1;
                bVar45 = false;
                goto LAB_002093e8;
              }
              uVar30 = uVar11 * 3 + uVar40;
              (cpi->rc).high_source_sad = 0;
              (cpi->rc).avg_source_sad = uVar30 >> 2;
              (cpi->rc).frame_source_sad = uVar40;
              bVar45 = true;
              if ((int)uVar27 < 1) {
                (cpi->rc).static_since_last_scene_change = 0;
                goto LAB_002094ea;
              }
LAB_00209410:
              (cpi->rc).percent_blocks_with_motion = (int)((uVar27 - iVar20) * 100) / (int)uVar27;
            }
            else {
LAB_002093e8:
              uVar30 = uVar11 * 3 + uVar40;
              (cpi->rc).high_source_sad = uVar21;
              (cpi->rc).avg_source_sad = uVar30 >> 2;
              (cpi->rc).frame_source_sad = uVar40;
              if (0 < (int)uVar27) goto LAB_00209410;
            }
            if (uVar40 == 0) {
              if (!bVar45) goto LAB_002094d4;
              uVar40 = 0;
            }
            else {
              (cpi->rc).static_since_last_scene_change = 0;
              if (!bVar45) {
LAB_002094d4:
                (cpi->rc).frames_since_scene_change = 0;
                (cpi->rc).static_since_last_scene_change = 1;
              }
            }
          }
LAB_002094ea:
          if (((cpi->svc).temporal_layer_id == 0) && ((cpi->rc).drop_count_consec < 3)) {
            (cpi->rc).high_motion_content_screen_rtc = 0;
            if (((10 < (cpi->oxcf).speed) &&
                ((((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN &&
                    (0x28 < (cpi->rc).percent_blocks_with_motion)) && (0x24003 < uVar30)) &&
                  ((0x9000 < (cpi->rc).prev_avg_source_sad &&
                   ((cpi->rc).avg_frame_low_motion < 0x3c)))) &&
                 (0x4ff < (local_e0->field_0).field_0.y_width)))) &&
               ((0x2cf < (local_e0->field_1).field_0.y_height &&
                ((cpi->rc).high_motion_content_screen_rtc = 1,
                ((cpi->common).seq_params)->bit_depth == AOM_BITS_8)))) {
              uVar27 = 0xc0;
              if (20000 < uVar40) {
                uVar27 = 0x200;
              }
              piVar44 = (int *)0xa0;
              if (20000 < uVar40) {
                piVar44 = (int *)0x200;
              }
              iVar20 = (local_e0->field_1).field_0.y_height;
              iVar37 = (local_e0->field_0).field_0.y_width;
              uVar38 = 0;
              do {
                if (uVar38 == 2) {
                  sVar26 = 2;
                  iVar33 = 3;
                }
                else if (uVar38 == 1) {
                  sVar26 = 2;
                  iVar33 = 1;
                }
                else {
                  iVar33 = 1;
                  sVar26 = 1;
                }
                iVar29 = (local_e0->field_0).field_0.y_width;
                iVar4 = (local_e0->field_1).field_0.y_height;
                uVar34 = (iVar29 * iVar33 >> sVar26) - 0x40;
                uVar21 = iVar29 + ~(uint)piVar44;
                if ((int)uVar21 < (int)uVar34) {
                  uVar34 = uVar21;
                }
                piVar32 = piVar44;
                if ((int)(uint)piVar44 <= (int)uVar34) {
                  piVar32 = (int *)(ulong)uVar34;
                }
                uVar21 = (iVar33 * iVar4 >> sVar26) - 0x40;
                if ((int)(iVar4 + ~uVar27) < (int)uVar21) {
                  uVar21 = iVar4 + ~uVar27;
                }
                uVar34 = uVar27;
                if ((int)uVar27 <= (int)uVar21) {
                  uVar34 = uVar21;
                }
                if (((int)piVar32 < iVar29 + -0x40) && ((int)uVar34 < iVar4 + -0x40)) {
                  best_intmv_col = 0;
                  local_ec = 0;
                  uVar34 = estimate_scroll_motion
                                     (cpi,(local_e0->field_5).buffers[0] + (int)(uVar34 * iVar41) +
                                          (long)piVar32,
                                      (local_88->field_5).buffers[0] + (int)(uVar34 * iVar31) +
                                      (long)piVar32,iVar41,iVar31,(BLOCK_SIZE)piVar32,uVar34,
                                      (int)&best_intmv_col,(int *)&local_ec,piVar44,uVar27,
                                      (int)in_stack_fffffffffffffee0);
                  uVar21 = -best_intmv_col;
                  if (0 < best_intmv_col) {
                    uVar21 = best_intmv_col;
                  }
                  uVar28 = 300;
                  if (uVar21 < 0x97) {
                    uVar15 = -local_ec;
                    if (0 < (int)local_ec) {
                      uVar15 = local_ec;
                    }
                    uVar28 = 300;
                    if (uVar15 < 0x97) {
                      uVar28 = 0x96;
                    }
                  }
                  if (uVar34 < uVar28) {
                    if (uVar21 < 0x11) {
                      uVar21 = -local_ec;
                      if (0 < (int)local_ec) {
                        uVar21 = local_ec;
                      }
                      if (uVar21 < 0x11) goto LAB_00209722;
                    }
                    (cpi->rc).high_motion_content_screen_rtc = 0;
                    break;
                  }
                }
LAB_00209722:
                if ((iVar20 * iVar37 < 0x1fa400) ||
                   (bVar45 = 1 < uVar38, uVar38 = uVar38 + 1, bVar45)) break;
              } while( true );
            }
            auVar18 = _DAT_004c80b0;
            auVar17 = _DAT_004c80a0;
            auVar14 = _DAT_004c8090;
            iVar20 = (cpi->svc).number_spatial_layers;
            uVar27 = (cpi->svc).number_temporal_layers;
            if ((1 < (long)iVar20) || (iVar20 == 1 && 1 < (int)uVar27)) {
              lVar42 = (ulong)uVar27 - 2;
              auVar50._8_4_ = (int)lVar42;
              auVar50._0_8_ = lVar42;
              auVar50._12_4_ = (int)((ulong)lVar42 >> 0x20);
              lVar42 = 0xce44;
              lVar39 = 0;
              auVar50 = auVar50 ^ _DAT_004c80b0;
              do {
                if (1 < (int)uVar27) {
                  iVar37 = (cpi->rc).high_motion_content_screen_rtc;
                  piVar44 = (int *)((long)&(((cpi->svc).layer_context)->rc).base_frame_target +
                                   lVar42);
                  uVar30 = 0;
                  do {
                    auVar51._8_4_ = (int)uVar30;
                    auVar51._0_8_ = uVar30;
                    auVar51._12_4_ = (int)(uVar30 >> 0x20);
                    auVar52 = (auVar51 | auVar17) ^ auVar18;
                    iVar41 = auVar50._4_4_;
                    if ((bool)(~(iVar41 < auVar52._4_4_ ||
                                auVar50._0_4_ < auVar52._0_4_ && auVar52._4_4_ == iVar41) & 1)) {
                      piVar44[-0x26a0] = iVar37;
                    }
                    if (auVar52._12_4_ <= auVar50._12_4_ &&
                        (auVar52._8_4_ <= auVar50._8_4_ || auVar52._12_4_ != auVar50._12_4_)) {
                      piVar44[-0x19c0] = iVar37;
                    }
                    auVar51 = (auVar51 | auVar14) ^ auVar18;
                    iVar31 = auVar51._4_4_;
                    if (iVar31 <= iVar41 && (iVar31 != iVar41 || auVar51._0_4_ <= auVar50._0_4_)) {
                      piVar44[-0xce0] = iVar37;
                      *piVar44 = iVar37;
                    }
                    uVar30 = uVar30 + 4;
                    piVar44 = piVar44 + 0x3380;
                  } while ((uVar27 + 2 & 0xfffffffc) != uVar30);
                }
                lVar39 = lVar39 + 1;
                lVar42 = lVar42 + (ulong)uVar27 * 0x3380;
              } while (lVar39 != iVar20);
            }
          }
          lVar39 = (long)(cpi->svc).number_spatial_layers;
          lVar42 = local_e8;
          if (1 < lVar39) {
            iVar20 = (cpi->svc).number_temporal_layers;
            iVar37 = (cpi->rc).high_source_sad;
            uVar11 = (cpi->rc).frame_source_sad;
            uVar12 = (cpi->rc).avg_source_sad;
            iVar41 = (cpi->rc).percent_blocks_with_motion;
            uVar13 = (cpi->rc).max_block_source_sad;
            piVar44 = &(cpi->svc).layer_context[(cpi->svc).temporal_layer_id].rc.high_source_sad;
            do {
              *piVar44 = iVar37;
              *(uint64_t *)(piVar44 + 6) = uVar11;
              *(uint64_t *)(piVar44 + 2) = uVar12;
              piVar44[0x28] = iVar41;
              *(uint64_t *)(piVar44 + 0x2a) = uVar13;
              piVar44 = piVar44 + (long)iVar20 * 0xce0;
              lVar39 = lVar39 + -1;
            } while (lVar39 != 0);
          }
        }
      }
      else {
LAB_00208a1b:
        aom_free(cpi->src_sad_blk_64x64);
        cpi->src_sad_blk_64x64 = (uint64_t *)0x0;
      }
    }
  }
  else {
    (cpi->rc).frame_source_sad = 0;
    (cpi->rc).avg_source_sad = (cpi->rc).avg_source_sad * 3 >> 2;
    (cpi->rc).percent_blocks_with_motion = 0;
    (cpi->rc).high_source_sad = 0;
  }
  if ((((*local_c0 == 0) && ((cpi->sf).rt_sf.rc_adjust_keyframe != 0)) ||
      (((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0 && ((cpi->rc).high_source_sad != 0)))) &&
     ((((cpi->svc).spatial_layer_id == 0 &&
       (pSVar9 = (cpi->common).seq_params, pSVar9->bit_depth == AOM_BITS_8)) &&
      ((cpi->oxcf).rc_cfg.max_intra_bitrate_pct != 0)))) {
    puVar35 = (local_90->source->field_5).buffers[0];
    iVar20 = (local_90->source->field_4).field_0.y_stride;
    (cpi->rc).perc_spatial_flat_blocks = 0;
    bVar45 = pSVar9->sb_size == BLOCK_128X128;
    iVar37 = pSVar9->mib_size >> bVar45;
    uVar30 = (long)((cpi->common).mi_params.mi_cols + iVar37 + -1) / (long)iVar37;
    uVar27 = (iVar37 + -1 + (cpi->common).mi_params.mi_rows) / iVar37;
    uVar38 = 0 >> bVar45;
    local_e8 = lVar42;
    if ((int)uVar27 < 1) {
      uVar40 = 0;
    }
    else {
      iVar41 = (int)uVar30;
      local_c8 = (long)((iVar20 - iVar41) * 0x40);
      uVar40 = 0;
      iVar37 = 0;
      do {
        uVar36 = uVar30 & 0xffffffff;
        local_d0 = (ulong)uVar38;
        if (0 < iVar41) {
          do {
            local_a8 = (double)CONCAT44(local_a8._4_4_,iVar37);
            uVar38 = (*cpi->ppi->fn_ptr[0xc].vf)(puVar35,iVar20,AV1_VAR_OFFS,0,&local_34);
            uVar40 = uVar40 + uVar38;
            iVar37 = local_a8._0_4_ + (uint)(uVar38 == 0);
            puVar35 = puVar35 + 0x40;
            uVar38 = (int)uVar36 - 1;
            uVar36 = (ulong)uVar38;
          } while (uVar38 != 0);
        }
        puVar35 = puVar35 + local_c8;
        uVar38 = (int)local_d0 + 1;
      } while (uVar38 != uVar27);
      iVar20 = 0;
      if (0 < iVar41) {
        iVar20 = iVar41;
      }
      uVar27 = uVar27 * iVar20;
      if (0 < (int)uVar27) {
        (cpi->rc).perc_spatial_flat_blocks = (iVar37 * 100) / (int)uVar27;
        uVar40 = uVar40 / uVar27;
      }
    }
    (cpi->rc).frame_spatial_variance = uVar40 >> 0xc;
    lVar42 = local_e8;
  }
  pbVar19 = local_c0;
  if ((cpi->oxcf).resize_cfg.resize_mode == '\x03') {
    if (((cpi->svc).number_spatial_layers == 1) && ((cpi->svc).temporal_layer_id == 0)) {
      if ((cpi->common).current_frame.frame_type == '\0') goto LAB_00208dde;
      dVar46 = cpi->framerate;
      if (dVar46 < (double)(cpi->rc).frames_since_key) {
        pAVar22 = cpi->ppi;
        iVar20 = (cpi->common).width;
        iVar37 = (cpi->common).height;
        iVar41 = 0x1e;
        if ((int)(dVar46 + dVar46) < 0x1e) {
          iVar41 = (int)(dVar46 + dVar46);
        }
        iVar31 = (cpi->rc).resize_avg_qp + (pAVar22->p_rc).last_q[1];
        (cpi->rc).resize_avg_qp = iVar31;
        auVar14 = SEXT816((pAVar22->p_rc).optimal_buffer_level * 0x1e) * ZEXT816(0xa3d70a3d70a3d70b)
        ;
        if ((pAVar22->p_rc).buffer_level <
            (long)((int)(auVar14._8_8_ >> 6) - (auVar14._12_4_ >> 0x1f))) {
          piVar44 = &(cpi->rc).resize_buffer_underflow;
          *piVar44 = *piVar44 + 1;
        }
        iVar33 = (cpi->rc).resize_count + 1;
        (cpi->rc).resize_count = iVar33;
        if (iVar41 <= iVar33) {
          iVar31 = iVar31 / iVar33;
          RVar2 = (cpi->rc).resize_state;
          if ((iVar37 * iVar20 < 0x63d8) || ((cpi->rc).resize_buffer_underflow <= iVar33 >> 2)) {
            if ((RVar2 != ORIG) &&
               (iVar41 = (cpi->rc).worst_quality, iVar31 < (iVar41 * 0x46) / 100)) {
              if ((RVar2 == THREE_QUARTER) || (iVar31 < iVar41 / 2)) {
                (cpi->rc).resize_state = ORIG;
                (cpi->rc).resize_avg_qp = 0;
                (cpi->rc).resize_buffer_underflow = 0;
                (cpi->rc).resize_count = 0;
                iVar41 = 1;
                iVar31 = 1;
                goto LAB_00209496;
              }
              if (RVar2 == ONE_HALF) goto LAB_00208dc3;
            }
LAB_00208dde:
            (cpi->rc).resize_avg_qp = 0;
            (cpi->rc).resize_buffer_underflow = 0;
            (cpi->rc).resize_count = 0;
          }
          else {
            if (RVar2 == ORIG) {
LAB_00208dc3:
              auVar49 = ZEXT812(1);
              (cpi->rc).resize_state = auVar49._0_4_;
              (cpi->rc).resize_avg_qp = auVar49._4_4_;
              (cpi->rc).resize_buffer_underflow = auVar49._8_4_;
              (cpi->rc).resize_count = 0;
              iVar31 = 4;
              iVar41 = 3;
            }
            else {
              if (RVar2 != THREE_QUARTER) goto LAB_00208dde;
              auVar48 = ZEXT812(2);
              (cpi->rc).resize_state = auVar48._0_4_;
              (cpi->rc).resize_avg_qp = auVar48._4_4_;
              (cpi->rc).resize_buffer_underflow = auVar48._8_4_;
              (cpi->rc).resize_count = 0;
              iVar31 = 2;
              iVar41 = 1;
            }
LAB_00209496:
            resize_reset_rc(cpi,((cpi->oxcf).frm_dim_cfg.width * iVar41) / iVar31,
                            (iVar41 * (cpi->oxcf).frm_dim_cfg.height) / iVar31,iVar20,iVar37);
          }
        }
      }
    }
    RVar2 = (cpi->rc).resize_state;
    iVar20 = (cpi->oxcf).frm_dim_cfg.width;
    if (RVar2 == ONE_HALF) {
      (cpi->resize_pending_params).width = iVar20 + 1 >> 1;
      iVar20 = (cpi->oxcf).frm_dim_cfg.height + 1 >> 1;
    }
    else if (RVar2 == THREE_QUARTER) {
      (cpi->resize_pending_params).width = iVar20 * 3 + 3 >> 2;
      iVar20 = (cpi->oxcf).frm_dim_cfg.height * 3 + 3 >> 2;
    }
    else {
      (cpi->resize_pending_params).width = iVar20;
      iVar20 = (cpi->oxcf).frm_dim_cfg.height;
    }
    (cpi->resize_pending_params).height = iVar20;
  }
  else {
    iVar20 = (cpi->resize_pending_params).width;
    if ((iVar20 != 0) && (iVar37 = (cpi->resize_pending_params).height, iVar37 != 0)) {
      iVar41 = (cpi->common).width;
      iVar31 = (cpi->common).height;
      if (iVar31 != iVar37 || iVar41 != iVar20) {
        resize_reset_rc(cpi,iVar20,iVar37,iVar41,iVar31);
      }
    }
  }
  iVar20 = (cpi->svc).temporal_layer_id;
  if (iVar20 == 0) {
    (cpi->rc).num_col_blscroll_last_tl0 = 0;
    (cpi->rc).num_row_blscroll_last_tl0 = 0;
  }
  if ((cpi->rc).rtc_external_ratectrl == 0) {
    iVar37 = (cpi->resize_pending_params).width;
    if ((((iVar37 == 0) || (iVar41 = (cpi->resize_pending_params).height, iVar41 == 0)) ||
        (((cpi->common).width == iVar37 && ((cpi->common).height == iVar41)))) &&
       ((cpi->rc).high_source_sad == 0)) {
      if (iVar20 != 0 || (cpi->rc).frames_till_gf_update_due != 0) goto LAB_00208eda;
    }
    else if (iVar20 != 0) goto LAB_00208eda;
    if ((cpi->svc).spatial_layer_id == 0) {
      set_baseline_gf_interval(cpi,*pbVar19);
    }
  }
LAB_00208eda:
  aVar3 = (cpi->oxcf).rc_cfg.mode;
  if (aVar3 == AOM_CBR) {
    if ((*pbVar19 & 0xfd) == 0) {
      iVar20 = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    }
    else {
      iVar20 = av1_calc_pframe_target_size_one_pass_cbr
                         (cpi,(pAVar5->gf_group).update_type[cpi->gf_frame_index]);
    }
  }
  else {
    if ((*pbVar19 & 0xfd) == 0) {
      lVar23 = (long)(cpi->rc).avg_frame_bandwidth;
      lVar39 = lVar23 * 0x19;
      uVar30 = (ulong)(cpi->oxcf).rc_cfg.max_intra_bitrate_pct;
      if ((uVar30 != 0) && (lVar23 = (long)(uVar30 * lVar23) / 100, lVar23 < lVar39)) {
        lVar39 = lVar23;
      }
      lVar23 = (long)(cpi->rc).max_frame_bandwidth;
      if (lVar39 < lVar23) {
        lVar23 = lVar39;
      }
      iVar20 = (int)lVar23;
    }
    else {
      iVar20 = av1_calc_pframe_target_size_one_pass_vbr
                         (cpi,(pAVar5->gf_group).update_type[cpi->gf_frame_index]);
    }
    if (aVar3 == AOM_Q) {
      (cpi->rc).active_worst_quality = (cpi->oxcf).rc_cfg.cq_level;
    }
  }
  av1_rc_set_frame_target(cpi,iVar20,(cpi->common).width,(cpi->common).height);
  (cpi->rc).base_frame_target = iVar20;
  (cpi->common).current_frame.frame_type = *pbVar19;
  if ((((cpi->ppi->use_svc != 0) && ((cpi->svc).use_flexible_mode == 0)) &&
      ((cpi->svc).ksvc_fixed_mode != 0)) &&
     ((1 < (cpi->svc).number_spatial_layers &&
      ((cpi->svc).layer_context[(int)lVar42].is_key_frame == 0)))) {
    *(byte *)&(cpi->ext_flags).ref_frame_flags = (byte)(cpi->ext_flags).ref_frame_flags ^ 8;
  }
  return;
}

Assistant:

void av1_get_one_pass_rt_params(AV1_COMP *cpi, FRAME_TYPE *const frame_type,
                                const EncodeFrameInput *frame_input,
                                unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  SVC *const svc = &cpi->svc;
  ResizePendingParams *const resize_pending_params =
      &cpi->resize_pending_params;
  int target;
  const int layer =
      LAYER_IDS_TO_IDX(svc->spatial_layer_id, svc->temporal_layer_id,
                       svc->number_temporal_layers);
  if (cpi->oxcf.rc_cfg.max_consec_drop_ms > 0) {
    double framerate =
        cpi->framerate > 1 ? round(cpi->framerate) : cpi->framerate;
    rc->max_consec_drop = saturate_cast_double_to_int(
        ceil(cpi->oxcf.rc_cfg.max_consec_drop_ms * framerate / 1000));
  }
  if (cpi->ppi->use_svc) {
    av1_update_temporal_layer_framerate(cpi);
    av1_restore_layer_context(cpi);
  }
  cpi->ppi->rtc_ref.bias_recovery_frame = set_flag_rps_bias_recovery_frame(cpi);
  // Set frame type.
  if (set_key_frame(cpi, frame_flags)) {
    *frame_type = KEY_FRAME;
    p_rc->this_key_frame_forced =
        cm->current_frame.frame_number != 0 && rc->frames_to_key == 0;
    rc->frames_to_key = cpi->oxcf.kf_cfg.key_freq_max;
    p_rc->kf_boost = DEFAULT_KF_BOOST_RT;
    gf_group->update_type[cpi->gf_frame_index] = KF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = KEY_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_RESET;
    if (cpi->ppi->use_svc) {
      if (cm->current_frame.frame_number > 0)
        av1_svc_reset_temporal_layers(cpi, 1);
      svc->layer_context[layer].is_key_frame = 1;
    }
    rc->frame_number_encoded = 0;
    cpi->ppi->rtc_ref.non_reference_frame = 0;
    rc->static_since_last_scene_change = 0;
  } else {
    *frame_type = INTER_FRAME;
    gf_group->update_type[cpi->gf_frame_index] = LF_UPDATE;
    gf_group->frame_type[cpi->gf_frame_index] = INTER_FRAME;
    gf_group->refbuf_state[cpi->gf_frame_index] = REFBUF_UPDATE;
    if (cpi->ppi->use_svc) {
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      lc->is_key_frame =
          svc->spatial_layer_id == 0
              ? 0
              : svc->layer_context[svc->temporal_layer_id].is_key_frame;
    }
    // If the user is setting the reference structure with
    // set_ref_frame_config and did not set any references, set the
    // frame type to Intra-only.
    if (cpi->ppi->rtc_ref.set_ref_frame_config) {
      int no_references_set = 1;
      for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        if (cpi->ppi->rtc_ref.reference[i]) {
          no_references_set = 0;
          break;
        }
      }

      // Set to intra_only_frame if no references are set.
      // The stream can start decoding on INTRA_ONLY_FRAME so long as the
      // layer with the intra_only_frame doesn't signal a reference to a slot
      // that hasn't been set yet.
      if (no_references_set) *frame_type = INTRA_ONLY_FRAME;
    }
  }
  if (cpi->active_map.enabled && cpi->rc.percent_blocks_inactive == 100) {
    rc->frame_source_sad = 0;
    rc->avg_source_sad = (3 * rc->avg_source_sad + rc->frame_source_sad) >> 2;
    rc->percent_blocks_with_motion = 0;
    rc->high_source_sad = 0;
  } else if (cpi->sf.rt_sf.check_scene_detection &&
             svc->spatial_layer_id == 0) {
    if (rc->prev_coded_width == cm->width &&
        rc->prev_coded_height == cm->height) {
      rc_scene_detection_onepass_rt(cpi, frame_input);
    } else {
      aom_free(cpi->src_sad_blk_64x64);
      cpi->src_sad_blk_64x64 = NULL;
    }
  }
  if (((*frame_type == KEY_FRAME && cpi->sf.rt_sf.rc_adjust_keyframe) ||
       (cpi->sf.rt_sf.rc_compute_spatial_var_sc && rc->high_source_sad)) &&
      svc->spatial_layer_id == 0 && cm->seq_params->bit_depth == 8 &&
      cpi->oxcf.rc_cfg.max_intra_bitrate_pct > 0)
    rc_spatial_act_onepass_rt(cpi, frame_input->source->y_buffer,
                              frame_input->source->y_stride);
  // Check for dynamic resize, for single spatial layer for now.
  // For temporal layers only check on base temporal layer.
  if (cpi->oxcf.resize_cfg.resize_mode == RESIZE_DYNAMIC) {
    if (svc->number_spatial_layers == 1 && svc->temporal_layer_id == 0)
      dynamic_resize_one_pass_cbr(cpi);
    if (rc->resize_state == THREE_QUARTER) {
      resize_pending_params->width = (3 + cpi->oxcf.frm_dim_cfg.width * 3) >> 2;
      resize_pending_params->height =
          (3 + cpi->oxcf.frm_dim_cfg.height * 3) >> 2;
    } else if (rc->resize_state == ONE_HALF) {
      resize_pending_params->width = (1 + cpi->oxcf.frm_dim_cfg.width) >> 1;
      resize_pending_params->height = (1 + cpi->oxcf.frm_dim_cfg.height) >> 1;
    } else {
      resize_pending_params->width = cpi->oxcf.frm_dim_cfg.width;
      resize_pending_params->height = cpi->oxcf.frm_dim_cfg.height;
    }
  } else if (is_frame_resize_pending(cpi)) {
    resize_reset_rc(cpi, resize_pending_params->width,
                    resize_pending_params->height, cm->width, cm->height);
  }
  if (svc->temporal_layer_id == 0) {
    rc->num_col_blscroll_last_tl0 = 0;
    rc->num_row_blscroll_last_tl0 = 0;
  }
  // Set the GF interval and update flag.
  if (!rc->rtc_external_ratectrl)
    set_gf_interval_update_onepass_rt(cpi, *frame_type);
  // Set target size.
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_cbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_cbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  } else {
    if (*frame_type == KEY_FRAME || *frame_type == INTRA_ONLY_FRAME) {
      target = av1_calc_iframe_target_size_one_pass_vbr(cpi);
    } else {
      target = av1_calc_pframe_target_size_one_pass_vbr(
          cpi, gf_group->update_type[cpi->gf_frame_index]);
    }
  }
  if (cpi->oxcf.rc_cfg.mode == AOM_Q)
    rc->active_worst_quality = cpi->oxcf.rc_cfg.cq_level;

  av1_rc_set_frame_target(cpi, target, cm->width, cm->height);
  rc->base_frame_target = target;
  cm->current_frame.frame_type = *frame_type;
  // For fixed mode SVC: if KSVC is enabled remove inter layer
  // prediction on spatial enhancement layer frames for frames
  // whose base is not KEY frame.
  if (cpi->ppi->use_svc && !svc->use_flexible_mode && svc->ksvc_fixed_mode &&
      svc->number_spatial_layers > 1 &&
      !svc->layer_context[layer].is_key_frame) {
    ExternalFlags *const ext_flags = &cpi->ext_flags;
    ext_flags->ref_frame_flags ^= AOM_GOLD_FLAG;
  }
}